

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall
CTcTokenizer::expand_macros
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcTokString *expbuf,int read_more,
          int allow_defined,int append)

{
  utf8_ptr src_00;
  tok_embed_level *ptVar1;
  CTcToken *pCVar2;
  tc_toktyp_t read_more_00;
  int iVar3;
  CTcMacroRsc *rsc;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  CTcHashEntryPp *pCVar9;
  tctok_incpath_t *ptVar10;
  long lVar11;
  undefined4 extraout_var;
  char *pcVar12;
  CTcTokString *in_RCX;
  CTcTokString *in_RDX;
  CTcTokenizer *in_RSI;
  CTcTokenizer *in_RDI;
  int in_R8D;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int expanded;
  size_t rem_len;
  size_t macro_ofs;
  CTcHashEntryPp *entry;
  int err;
  CTcMacroRsc *res;
  CTcTokStringRef local_srcbuf;
  utf8_ptr local_src;
  size_t startofs;
  CTcTokString *subexp;
  CTcToken tok;
  tc_toktyp_t typ;
  size_t in_stack_000005a8;
  utf8_ptr *in_stack_000005b0;
  CTcTokString *in_stack_000005b8;
  CTcTokString *in_stack_000005c0;
  CTcMacroRsc *in_stack_000005c8;
  CTcTokenizer *in_stack_000005d0;
  CTcHashEntryPp *in_stack_000005e0;
  int in_stack_000005e8;
  int in_stack_000005f0;
  int *in_stack_000005f8;
  CTcHashEntryPp *in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  int in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  CTcTokenizer *in_stack_fffffffffffffd58;
  tc_toktyp_t in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  CTcTokString *in_stack_fffffffffffffd98;
  CTcMacroRsc *pCVar13;
  CTcTokString *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  tc_toktyp_t in_stack_fffffffffffffdac;
  long in_stack_fffffffffffffdf0;
  tok_embed_ctx *in_stack_fffffffffffffdf8;
  CTcToken *in_stack_fffffffffffffe00;
  utf8_ptr *in_stack_fffffffffffffe08;
  CTcTokString *in_stack_fffffffffffffe10;
  int local_ec;
  int local_b4;
  undefined1 local_a8 [40];
  tctok_incpath_t *local_80;
  CTcMacroRsc *local_78;
  CTcToken local_70;
  int in_stack_ffffffffffffffb8;
  int iVar14;
  CTcTokString *pCVar15;
  CTcTokString *src_01;
  CTcTokenizer *pCVar16;
  int local_14;
  
  CTcToken::CTcToken(&local_70);
  utf8_ptr::utf8_ptr((utf8_ptr *)(local_a8 + 0x20));
  CTcTokStringRef::CTcTokStringRef
            ((CTcTokStringRef *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40));
  local_b4 = 0;
  rsc = alloc_macro_rsc(in_stack_fffffffffffffd58);
  if (rsc == (CTcMacroRsc *)0x0) {
    local_14 = 1;
  }
  else {
    local_78 = rsc;
    if (in_RSI == (CTcTokenizer *)0x0) {
      pcVar4 = utf8_ptr::getptr((utf8_ptr *)in_RDX);
      pcVar5 = utf8_ptr::getptr((utf8_ptr *)in_RDX);
      sVar6 = strlen(pcVar5);
      CTcTokStringRef::set_buffer((CTcTokStringRef *)local_a8,pcVar4,sVar6);
      in_RSI = (CTcTokenizer *)local_a8;
    }
    else if (in_RDX == (CTcTokString *)0x0) {
      pcVar4 = CTcTokString::get_text((CTcTokString *)in_RSI);
      utf8_ptr::set((utf8_ptr *)(local_a8 + 0x20),pcVar4);
      in_RDX = (CTcTokString *)(local_a8 + 0x20);
    }
    if (in_stack_00000008 == 0) {
      (*in_RCX->_vptr_CTcTokString[9])();
    }
    pCVar15 = in_RCX;
    sVar7 = CTcTokString::get_text_len(in_RCX);
    sVar8 = CTcTokString::get_text_len((CTcTokString *)in_RSI);
    (*in_RCX->_vptr_CTcTokString[2])(in_RCX,sVar7 + sVar8);
    pcVar4 = utf8_ptr::getptr((utf8_ptr *)in_RDX);
    pcVar5 = CTcTokString::get_text((CTcTokString *)in_RSI);
    local_80 = (tctok_incpath_t *)(pcVar4 + -(long)pcVar5);
    read_more_00 = next_on_line(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                                in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                                (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
    while (read_more_00 != TOKT_EOF) {
      if ((read_more_00 == TOKT_SYM) &&
         (iVar3 = CTcToken::get_fully_expanded(&local_70), iVar3 == 0)) {
        CTcToken::get_text(&local_70);
        CTcToken::get_text_len(&local_70);
        pCVar9 = find_define((CTcTokenizer *)
                             CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             (char *)in_stack_fffffffffffffd38,0x296a2d);
        if (pCVar9 == (CTcHashEntryPp *)0x0) {
LAB_00296aae:
          if ((in_R9D != 0) && (sVar7 = CTcToken::get_text_len(&local_70), sVar7 == 7)) {
            pcVar4 = CTcToken::get_text(&local_70);
            iVar3 = memcmp(pcVar4,"defined",7);
            if (iVar3 == 0) goto LAB_00296b1e;
          }
          goto LAB_002970b2;
        }
        CTcTokString::get_text_end((CTcTokString *)in_RSI);
        src_00.p_._4_4_ = in_stack_fffffffffffffd4c;
        src_00.p_._0_4_ = in_stack_fffffffffffffd48;
        iVar3 = scan_for_prior_expansion
                          (src_00,(char *)CONCAT44(in_stack_fffffffffffffd44,
                                                   in_stack_fffffffffffffd40),
                           in_stack_fffffffffffffd38);
        if (iVar3 != 0) goto LAB_00296aae;
LAB_00296b1e:
        pcVar4 = CTcToken::get_text(&local_70);
        pcVar5 = CTcTokString::get_text((CTcTokString *)in_RSI);
        ptVar10 = (tctok_incpath_t *)(pcVar4 + -(long)pcVar5);
        if (pCVar9 == (CTcHashEntryPp *)0x0) {
          local_b4 = expand_defined((CTcTokenizer *)
                                    CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                                    in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                                    (utf8_ptr *)
                                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
          local_ec = 1;
        }
        else {
          iVar3 = in_R9D;
          iVar14 = in_R8D;
          local_b4 = expand_macro(in_stack_000005d0,in_stack_000005c8,in_stack_000005c0,
                                  in_stack_000005b8,in_stack_000005b0,in_stack_000005a8,
                                  in_stack_000005e0,in_stack_000005e8,in_stack_000005f0,
                                  in_stack_000005f8);
          in_stack_fffffffffffffd38 = pCVar9;
          in_stack_fffffffffffffd40 = in_R8D;
          in_stack_fffffffffffffd48 = in_R9D;
          in_R9D = iVar3;
          in_R8D = iVar14;
        }
        if (local_b4 != 0) goto LAB_00297191;
        if (local_ec == 0) {
          read_more_00 = next_on_line(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                                      in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                                      (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
        }
        else {
          src_01 = pCVar15;
          pcVar4 = CTcTokString::get_text((CTcTokString *)in_RSI);
          (*pCVar15->_vptr_CTcTokString[4])
                    (pCVar15,pcVar4 + (long)local_80,(long)ptVar10 - (long)local_80);
          pcVar4 = utf8_ptr::getptr((utf8_ptr *)in_RDX);
          pcVar5 = CTcTokString::get_text((CTcTokString *)in_RSI);
          local_80 = (tctok_incpath_t *)(pcVar4 + -(long)pcVar5);
          sVar7 = CTcTokString::get_text_len((CTcTokString *)in_RSI);
          sVar6 = sVar7 - (long)local_80;
          if (in_R8D == 0) {
            pCVar13 = local_78;
            pcVar4 = CTcTokString::get_text((CTcTokString *)in_RSI);
            (*(pCVar13->line_exp_)._vptr_CTcTokString[4])(pCVar13,pcVar4 + (long)local_80,sVar6);
            local_b4 = expand_macros(in_RSI,in_RDX,(utf8_ptr *)src_01,
                                     (CTcTokString *)CONCAT44(in_R8D,in_R9D),read_more_00,
                                     in_stack_ffffffffffffffb8,unaff_retaddr);
            goto LAB_00297191;
          }
          pCVar16 = in_RSI;
          sVar7 = CTcTokString::get_text_len(&local_78->line_exp_);
          in_stack_fffffffffffffe10 = in_RDX;
          (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,(char *)((long)ptVar10 + sVar7 + sVar6));
          in_RDX = in_stack_fffffffffffffe10;
          lVar11 = (**(code **)(*(long *)pCVar16 + 0x50))();
          utf8_ptr::set((utf8_ptr *)in_stack_fffffffffffffe10,ptVar10->path + lVar11 + -8);
          in_stack_fffffffffffffe08 = (utf8_ptr *)(**(code **)(*(long *)pCVar16 + 0x50))();
          in_stack_fffffffffffffdf8 =
               (tok_embed_ctx *)(ptVar10->path + (long)(in_stack_fffffffffffffe08 + -1));
          in_stack_fffffffffffffe00 = (CTcToken *)CTcTokString::get_text_len(&local_78->line_exp_);
          ptVar1 = in_stack_fffffffffffffdf8->stk;
          pCVar2 = in_stack_fffffffffffffe00 + -1;
          in_stack_fffffffffffffdf0 = (**(code **)(*(long *)pCVar16 + 0x50))();
          memmove((void *)((long)&((tok_embed_ctx *)(ptVar1 + -1))->stk[0].parens +
                          (long)&pCVar2->int_val_),local_80->path + in_stack_fffffffffffffdf0 + -8,
                  sVar6);
          lVar11 = (**(code **)(*(long *)pCVar16 + 0x50))();
          iVar3 = (*(local_78->line_exp_)._vptr_CTcTokString[10])();
          sVar7 = CTcTokString::get_text_len(&local_78->line_exp_);
          memcpy(ptVar10->path + lVar11 + -8,(void *)CONCAT44(extraout_var,iVar3),sVar7);
          in_RSI = pCVar16;
          sVar7 = CTcTokString::get_text_len(&local_78->line_exp_);
          (**(code **)(*(long *)pCVar16 + 0x58))(pCVar16,(char *)((long)ptVar10 + sVar7 + sVar6));
          local_80 = ptVar10;
          in_stack_fffffffffffffdac =
               next_on_line(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                            in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                            (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
          read_more_00 = in_stack_fffffffffffffdac;
          pCVar15 = src_01;
        }
      }
      else {
LAB_002970b2:
        in_stack_fffffffffffffd90 =
             next_on_line(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                          in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                          (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20));
        read_more_00 = in_stack_fffffffffffffd90;
      }
    }
    pcVar4 = CTcTokString::get_text((CTcTokString *)in_RSI);
    pcVar4 = pcVar4 + (long)local_80;
    pcVar5 = CTcToken::get_text(&local_70);
    ptVar10 = local_80;
    pcVar12 = CTcTokString::get_text((CTcTokString *)in_RSI);
    (*pCVar15->_vptr_CTcTokString[4])(pCVar15,pcVar4,pcVar5 + (-(long)pcVar12 - (long)ptVar10));
LAB_00297191:
    release_macro_rsc(in_RDI,rsc);
    local_14 = local_b4;
  }
  CTcTokStringRef::~CTcTokStringRef((CTcTokStringRef *)0x2971ce);
  return local_14;
}

Assistant:

int CTcTokenizer::expand_macros(CTcTokString *srcbuf, utf8_ptr *src,
                                CTcTokString *expbuf, int read_more,
                                int allow_defined, int append)
{
    tc_toktyp_t typ;
    CTcToken tok;
    CTcTokString *subexp;
    size_t startofs;
    utf8_ptr local_src;
    CTcTokStringRef local_srcbuf;
    CTcMacroRsc *res;
    int err;

    /* presume success */
    err = 0;

    /* get a macro expansion resource object */
    res = alloc_macro_rsc();
    if (res == 0)
        return 1;

    /* get our subexpression buffer from the resource object */
    subexp = &res->line_exp_;

    /* if there's no source buffer or source pointer, provide one */
    if (srcbuf == 0)
    {
        /* 
         *   there's no source buffer - provide our own non-allocated
         *   buffer tied to the caller's buffer 
         */
        local_srcbuf.set_buffer(src->getptr(), strlen(src->getptr()));
        srcbuf = &local_srcbuf;
    }
    else if (src == 0)
    {
        /* 
         *   there's no source pointer - start at the beginning of the
         *   source buffer 
         */
        local_src.set((char *)srcbuf->get_text());
        src = &local_src;
    }

    /* clear the expansion buffer, unless we're appending to the buffer */
    if (!append)
        expbuf->clear_text();

    /* 
     *   Make sure we have room for a copy of the source line.  This is an
     *   optimization for the simple case where we'll just copy the source
     *   line unchanged, so that we don't have to repeatedly expand the
     *   buffer; we will, however, expand the buffer dynamically later, if
     *   this pre-allocation should prove to be insufficient. 
     */
    expbuf->ensure_space(expbuf->get_text_len() + srcbuf->get_text_len());

    /* note the starting offset, if we have an underlying string buffer */
    startofs = src->getptr() - srcbuf->get_text();

    /* read the first token */
    typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);

    /* scan through the tokens on the line, looking for macros to expand */
    while (typ != TOKT_EOF)
    {
        /* 
         *   if it's a symbol, and it hasn't already been marked as fully
         *   expanded, look it up in the #define table 
         */
        if (typ == TOKT_SYM && !tok.get_fully_expanded())
        {
            CTcHashEntryPp *entry;

            /*
             *   Look up the symbol in the #define symbol table.  If we
             *   find it, expand the macro.  Otherwise, if the "defined"
             *   operator is active, check for that.
             *   
             *   Do not expand the macro if we find that it has already
             *   been expanded on a prior scan through the current text.  
             */
            entry = find_define(tok.get_text(), tok.get_text_len());
            if ((entry != 0
                 && !scan_for_prior_expansion(*src, srcbuf->get_text_end(),
                                              entry))
                || (allow_defined
                    && tok.get_text_len() == 7
                    && memcmp(tok.get_text(), "defined", 7) == 0))
            {
                size_t macro_ofs;
                size_t rem_len;
                int expanded;

                /* get the offset of the macro token in the source buffer */
                macro_ofs = tok.get_text() - srcbuf->get_text();
                
                /* expand it into our sub-expansion buffer */
                if (entry != 0)
                {
                    /* expand the macro */
                    err = expand_macro(res, subexp, srcbuf, src,
                                       macro_ofs, entry,
                                       read_more, allow_defined, &expanded);
                }
                else
                {
                    /* parse and expand the defined() operator */
                    err = expand_defined(subexp, srcbuf, src);

                    /* "defined" always expands if there's not an error */
                    expanded = TRUE;
                }

                /* if an error occurred, return failure */
                if (err)
                    goto done;

                /*
                 *   if we expanded something, append everything we
                 *   skipped preceding the macro, then rescan; otherwise,
                 *   just keep going without a rescan 
                 */
                if (expanded)
                {
                    /* copy the preceding text to the output */
                    expbuf->append(srcbuf->get_text() + startofs,
                                   macro_ofs - startofs);
                }
                else
                {
                    /* 
                     *   we didn't expand - get the next token after the
                     *   macro 
                     */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);

                    /* continue processing from this token */
                    continue;
                }

                /*
                 *   We must now insert the expansion into the source
                 *   buffer at the current point, and re-scan the
                 *   expansion, *along with* the rest of the original
                 *   source line (this is how ANSI C specifies the
                 *   process).
                 *   
                 *   If we can read more, we must be reading out of the
                 *   main input line buffer, so insert the expansion text
                 *   directly into the original source stream, and
                 *   continue reading out of the source stream; this will
                 *   simplify the case where we must read more data from
                 *   the file in the course of the expansion.  If we can't
                 *   read more, simply copy the remainder of the current
                 *   input line onto the expanded macro and use it as the
                 *   new input buffer.  
                 */

                /* get the current offset in the source line */
                startofs = src->getptr() - srcbuf->get_text();

                /* figure out how much is left on the current line */
                rem_len = srcbuf->get_text_len() - startofs;

                /* check to see if we can read more */
                if (read_more)
                {
                    /*
                     *   we're reading from the original line input buffer
                     *   -- insert the expansion into the source buffer at
                     *   the current point, replacing the original macro
                     *   text
                     */
                    
                    /* make sure we have room for adding the expansion text */
                    srcbuf->ensure_space(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* make sure src is still pointing to the right place */
                    src->set(srcbuf->get_buf() + macro_ofs);
                
                    /* move the remainder of the current line to make room */
                    memmove(srcbuf->get_buf() + macro_ofs
                            + subexp->get_text_len(),
                            srcbuf->get_buf() + startofs,
                            rem_len);
                
                    /* insert the expansion text */
                    memcpy(srcbuf->get_buf() + macro_ofs, subexp->get_buf(),
                           subexp->get_text_len());
                
                    /* set the new source length */
                    srcbuf->set_text_len(macro_ofs + rem_len
                                         + subexp->get_text_len());

                    /* the new starting offset is the current position */
                    startofs = macro_ofs;

                    /* get the next token */
                    typ = next_on_line(srcbuf, src, &tok,
                                       &macro_in_embedding_, TRUE);
                    
                    /* continue processing from this token */
                    continue;
                }
                else
                {
                    /* 
                     *   we're reading from a read-only buffer -- add the
                     *   remainder of the source to the expansion buffer,
                     *   and recursively parse the remainder 
                     */
                    subexp->append(srcbuf->get_text() + startofs, rem_len);

                    /* 
                     *   evaluate the remainder recursively and append it
                     *   to the expansion already in progress 
                     */
                    err = expand_macros(subexp, 0, expbuf, FALSE,
                                        allow_defined, TRUE);

                    /* we're done */
                    goto done;
                }
            }
        }

        /* get the next token */
        typ = next_on_line(srcbuf, src, &tok, &macro_in_embedding_, TRUE);
    }

    /* add the remainder of the source to the output */
    expbuf->append(srcbuf->get_text() + startofs,
                   tok.get_text() - startofs - srcbuf->get_text());

done:
    /* release our macro resource object */
    release_macro_rsc(res);
    
    /* return the result */
    return err;
}